

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

class_<anurbs::NurbsSurfaceGeometry<3L>,_anurbs::SurfaceBase<3L>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
* __thiscall
pybind11::
class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
::
def<std::pair<std::vector<long,std::allocator<long>>,Eigen::Matrix<double,_1,_1,1,_1,_1>>(anurbs::NurbsSurfaceGeometry<3l>::*)(double,double,long,long,long)const,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg>
          (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
           *this,char *name_,offset_in_Model_to_subr *f,arg *extra,arg *extra_1,arg *extra_2,
          arg *extra_3,arg *extra_4)

{
  offset_in_Model_to_subr f_00;
  name *extra_00;
  handle local_78;
  cpp_function cf;
  handle local_68;
  object local_60;
  char *local_58 [4];
  PyObject *local_38;
  
  f_00 = *f;
  extra_00 = (name *)f[1];
  local_78.m_ptr = *(PyObject **)this;
  local_60.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_58[0] = name_;
  getattr((pybind11 *)&local_68,local_78,name_,(PyObject *)&_Py_NoneStruct);
  local_38 = local_68.m_ptr;
  cpp_function::
  cpp_function<std::pair<std::vector<long,std::allocator<long>>,Eigen::Matrix<double,_1,_1,1,_1,_1>>,anurbs::NurbsSurfaceGeometry<3l>,double,double,long,long,long,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg>
            (&cf,f_00,extra_00,(is_method *)local_58,(sibling *)&local_78,(arg *)&local_38,extra,
             extra_1,extra_2,extra_3);
  pybind11::object::~object((object *)&local_68);
  pybind11::object::~object(&local_60);
  cpp_function::name((cpp_function *)&local_78);
  detail::object_api<pybind11::handle>::attr
            ((obj_attr_accessor *)local_58,(object_api<pybind11::handle> *)this,local_78);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::operator=
            ((accessor<pybind11::detail::accessor_policies::obj_attr> *)local_58,&cf);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor
            ((accessor<pybind11::detail::accessor_policies::obj_attr> *)local_58);
  pybind11::object::~object((object *)&local_78);
  pybind11::object::~object((object *)&cf);
  return (class_<anurbs::NurbsSurfaceGeometry<3L>,_anurbs::SurfaceBase<3L>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
          *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = cf;
        return *this;
    }